

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_icc.c
# Opt level: O0

int jas_iccattrtab_resize(jas_iccattrtab_t *tab,int maxents)

{
  jas_iccattr_t *local_30;
  jas_iccattr_t *newattrs;
  int maxents_local;
  jas_iccattrtab_t *tab_local;
  
  if (tab->numattrs <= maxents) {
    if (tab->attrs == (jas_iccattr_t *)0x0) {
      local_30 = (jas_iccattr_t *)jas_alloc2((long)maxents,0x10);
    }
    else {
      local_30 = (jas_iccattr_t *)jas_realloc2(tab->attrs,(long)maxents,0x10);
    }
    if (local_30 == (jas_iccattr_t *)0x0) {
      tab_local._4_4_ = -1;
    }
    else {
      tab->attrs = local_30;
      tab->maxattrs = maxents;
      tab_local._4_4_ = 0;
    }
    return tab_local._4_4_;
  }
  __assert_fail("maxents >= tab->numattrs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/base/jas_icc.c"
                ,0x2e8,"int jas_iccattrtab_resize(jas_iccattrtab_t *, int)");
}

Assistant:

static int jas_iccattrtab_resize(jas_iccattrtab_t *tab, int maxents)
{
	jas_iccattr_t *newattrs;
	assert(maxents >= tab->numattrs);
	newattrs = tab->attrs ? jas_realloc2(tab->attrs, maxents,
	  sizeof(jas_iccattr_t)) : jas_alloc2(maxents, sizeof(jas_iccattr_t));
	if (!newattrs) {
		return -1;
	}
	tab->attrs = newattrs;
	tab->maxattrs = maxents;
	return 0;
}